

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DropTriggerPtr(Parse *pParse,Trigger *pTrigger)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Parse *pParse_00;
  char *pcVar4;
  Vdbe *pVVar5;
  undefined8 *in_RSI;
  Parse *in_RDI;
  char *zTab;
  char *zDb;
  int code;
  int iDb;
  sqlite3 *db;
  Vdbe *v;
  Table *pTable;
  undefined4 in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  char *zArg3;
  undefined4 uVar6;
  sqlite3 *zArg1;
  undefined8 in_stack_ffffffffffffffe0;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  zArg1 = in_RDI->db;
  iVar1 = sqlite3SchemaToIndex(in_RDI->db,(Schema *)in_RSI[5]);
  pParse_00 = (Parse *)tableOfTrigger((Trigger *)0x1b094f);
  uVar6 = 0x10;
  zArg3 = zArg1->aDb[iVar1].zDbSName;
  pcVar4 = "sqlite_master";
  if (iVar1 == 1) {
    pcVar4 = "sqlite_temp_master";
    uVar6 = 0xe;
  }
  iVar2 = sqlite3AuthCheck(pParse_00,iVar3,(char *)zArg1,(char *)CONCAT44(iVar1,uVar6),zArg3);
  if (((iVar2 == 0) &&
      (iVar3 = sqlite3AuthCheck(pParse_00,iVar3,(char *)zArg1,(char *)CONCAT44(iVar1,uVar6),zArg3),
      iVar3 == 0)) &&
     (pVVar5 = sqlite3GetVdbe((Parse *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                             ), pVVar5 != (Vdbe *)0x0)) {
    sqlite3NestedParse(in_RDI,"DELETE FROM %Q.%s WHERE name=%Q AND type=\'trigger\'",
                       zArg1->aDb[iVar1].zDbSName,"sqlite_master",*in_RSI);
    iVar3 = (int)pVVar5;
    sqlite3ChangeCookie((Parse *)CONCAT44(iVar1,uVar6),(int)((ulong)zArg3 >> 0x20));
    sqlite3VdbeAddOp4((Vdbe *)CONCAT44(iVar1,uVar6),(int)((ulong)zArg3 >> 0x20),(int)zArg3,
                      (int)((ulong)pcVar4 >> 0x20),(int)pcVar4,
                      (char *)((ulong)in_stack_ffffffffffffffbc << 0x20),iVar3);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DropTriggerPtr(Parse *pParse, Trigger *pTrigger){
  Table   *pTable;
  Vdbe *v;
  sqlite3 *db = pParse->db;
  int iDb;

  iDb = sqlite3SchemaToIndex(pParse->db, pTrigger->pSchema);
  assert( iDb>=0 && iDb<db->nDb );
  pTable = tableOfTrigger(pTrigger);
  assert( pTable );
  assert( pTable->pSchema==pTrigger->pSchema || iDb==1 );
#ifndef SQLITE_OMIT_AUTHORIZATION
  {
    int code = SQLITE_DROP_TRIGGER;
    const char *zDb = db->aDb[iDb].zDbSName;
    const char *zTab = SCHEMA_TABLE(iDb);
    if( iDb==1 ) code = SQLITE_DROP_TEMP_TRIGGER;
    if( sqlite3AuthCheck(pParse, code, pTrigger->zName, pTable->zName, zDb) ||
      sqlite3AuthCheck(pParse, SQLITE_DELETE, zTab, 0, zDb) ){
      return;
    }
  }
#endif

  /* Generate code to destroy the database record of the trigger.
  */
  assert( pTable!=0 );
  if( (v = sqlite3GetVdbe(pParse))!=0 ){
    sqlite3NestedParse(pParse,
       "DELETE FROM %Q.%s WHERE name=%Q AND type='trigger'",
       db->aDb[iDb].zDbSName, MASTER_NAME, pTrigger->zName
    );
    sqlite3ChangeCookie(pParse, iDb);
    sqlite3VdbeAddOp4(v, OP_DropTrigger, iDb, 0, 0, pTrigger->zName, 0);
  }
}